

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

FloatImageTexture *
pbrt::FloatImageTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  FilterFunction *pFVar2;
  WrapMode *args_3;
  FloatImageTexture *pFVar3;
  char *__s;
  allocator<char> local_117;
  allocator<char> local_116;
  bool invert;
  Float local_114;
  string filename;
  optional<pbrt::WrapMode> wrapMode;
  optional<pbrt::FilterFunction> ff;
  string encodingString;
  Float scale;
  MIPMapFilterOptions local_b8;
  ColorEncodingHandle encoding;
  string wrapString;
  string local_70;
  string filter;
  TextureMapping2DHandle map;
  Allocator alloc_local;
  
  alloc_local = alloc;
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filter,"maxanisotropy",(allocator<char> *)&wrapString);
  local_114 = TextureParameterDictionary::GetOneFloat(parameters,&filter,8.0);
  std::__cxx11::string::~string((string *)&filter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wrapString,"filter",(allocator<char> *)&encodingString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"bilinear",(allocator<char> *)&encoding);
  TextureParameterDictionary::GetOneString(&filter,parameters,&wrapString,&filename);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&wrapString);
  local_b8.filter = EWA;
  local_b8.maxAnisotropy = local_114;
  ParseFilter((pbrt *)&ff,&filter);
  if (ff.set == true) {
    pFVar2 = pstd::optional<pbrt::FilterFunction>::value(&ff);
    local_b8.filter = *pFVar2;
  }
  else {
    Error<std::__cxx11::string&>(loc,"%s: filter function unknown",&filter);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"wrap",(allocator<char> *)&encoding);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&encodingString,"repeat",(allocator<char> *)&local_70);
  TextureParameterDictionary::GetOneString(&wrapString,parameters,&filename,&encodingString);
  std::__cxx11::string::~string((string *)&encodingString);
  std::__cxx11::string::~string((string *)&filename);
  ParseWrapMode((pbrt *)&wrapMode,wrapString._M_dataplus._M_p);
  if (wrapMode.set != false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,"scale",(allocator<char> *)&encodingString);
    local_114 = TextureParameterDictionary::GetOneFloat(parameters,&filename,1.0);
    std::__cxx11::string::~string((string *)&filename);
    scale = local_114;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,"invert",(allocator<char> *)&encodingString);
    bVar1 = TextureParameterDictionary::GetOneBool(parameters,&filename,false);
    std::__cxx11::string::~string((string *)&filename);
    invert = bVar1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&encoding,"filename",&local_116);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_117);
    TextureParameterDictionary::GetOneString
              (&encodingString,parameters,(string *)&encoding,&local_70);
    ResolveFilename(&filename,&encodingString);
    std::__cxx11::string::~string((string *)&encodingString);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&encoding);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encodingString,"png",(allocator<char> *)&encoding);
    bVar1 = HasExtension(&filename,&encodingString);
    std::__cxx11::string::~string((string *)&encodingString);
    std::__cxx11::string::string<std::allocator<char>>((string *)&encoding,"encoding",&local_116);
    __s = "linear";
    if (bVar1) {
      __s = "sRGB";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_117);
    TextureParameterDictionary::GetOneString
              (&encodingString,parameters,(string *)&encoding,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&encoding);
    ColorEncodingHandle::Get((string *)&encoding,(memory_resource *)&encodingString);
    args_3 = pstd::optional<pbrt::WrapMode>::value(&wrapMode);
    pFVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::FloatImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,pbrt::MIPMapFilterOptions&,pbrt::WrapMode&,float&,bool&,pbrt::ColorEncodingHandle&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       (&alloc_local,&map,&filename,&local_b8,args_3,&scale,&invert,&encoding,
                        &alloc_local);
    std::__cxx11::string::~string((string *)&encodingString);
    std::__cxx11::string::~string((string *)&filename);
    pstd::optional<pbrt::WrapMode>::~optional(&wrapMode);
    std::__cxx11::string::~string((string *)&wrapString);
    pstd::optional<pbrt::FilterFunction>::~optional(&ff);
    std::__cxx11::string::~string((string *)&filter);
    return pFVar3;
  }
  ErrorExit<std::__cxx11::string&>("%s: wrap mode unknown",&wrapString);
}

Assistant:

FloatImageTexture *FloatImageTexture::Create(const Transform &renderFromTexture,
                                             const TextureParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    // Initialize _ImageTexture_ parameters
    Float maxAniso = parameters.GetOneFloat("maxanisotropy", 8.f);
    std::string filter = parameters.GetOneString("filter", "bilinear");
    MIPMapFilterOptions filterOptions;
    filterOptions.maxAnisotropy = maxAniso;
    pstd::optional<FilterFunction> ff = ParseFilter(filter);
    if (ff)
        filterOptions.filter = *ff;
    else
        Error(loc, "%s: filter function unknown", filter);

    std::string wrapString = parameters.GetOneString("wrap", "repeat");
    pstd::optional<WrapMode> wrapMode = ParseWrapMode(wrapString.c_str());
    if (!wrapMode)
        ErrorExit("%s: wrap mode unknown", wrapString);
    Float scale = parameters.GetOneFloat("scale", 1.f);
    bool invert = parameters.GetOneBool("invert", false);
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));

    const char *defaultEncoding = HasExtension(filename, "png") ? "sRGB" : "linear";
    std::string encodingString = parameters.GetOneString("encoding", defaultEncoding);
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString, alloc);

    return alloc.new_object<FloatImageTexture>(map, filename, filterOptions, *wrapMode,
                                               scale, invert, encoding, alloc);
}